

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int windowExprGtZero(Parse *pParse,Expr *pExpr)

{
  sqlite3_value *v;
  i64 iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  sqlite3_value *pVal;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pVal = (sqlite3_value *)0x0;
  sqlite3ValueFromExpr(pParse->db,pExpr,pParse->db->enc,'C',&pVal);
  v = pVal;
  if (pVal == (sqlite3_value *)0x0) {
    uVar2 = 0;
  }
  else {
    iVar1 = sqlite3VdbeIntValue(pVal);
    uVar2 = (uint)(0 < (int)iVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    sqlite3ValueFree(v);
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int windowExprGtZero(Parse *pParse, Expr *pExpr){
  int ret = 0;
  sqlite3 *db = pParse->db;
  sqlite3_value *pVal = 0;
  sqlite3ValueFromExpr(db, pExpr, db->enc, SQLITE_AFF_NUMERIC, &pVal);
  if( pVal && sqlite3_value_int(pVal)>0 ){
    ret = 1;
  }
  sqlite3ValueFree(pVal);
  return ret;
}